

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGhsMultiGenerator::OrderedTargetDependSet::OrderedTargetDependSet
          (OrderedTargetDependSet *this,TargetDependSet *targets,string *first)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  long lVar3;
  uint *local_68;
  long local_60;
  uint local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint *local_48;
  long local_40;
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pcVar2 = (first->_M_dataplus)._M_p;
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + first->_M_string_length);
  lVar3 = local_60;
  if (local_68 == &local_58) {
    uStack_30 = uStack_50;
    uStack_2c = uStack_4c;
    local_48 = (uint *)&local_38;
  }
  else {
    local_48 = local_68;
  }
  local_38 = CONCAT44(uStack_54,local_58);
  local_40 = local_60;
  local_60 = 0;
  local_58 = local_58 & 0xffffff00;
  (this->
  super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  )._M_t._M_impl.super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>._M_key_compare
  .First._M_dataplus =
       (_Alloc_hider)
       &(this->
        super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
        )._M_t._M_impl.super__Rb_tree_key_compare<cmGlobalGhsMultiGenerator::TargetCompare>.
        _M_key_compare.First.field_2;
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char*>((string *)this,local_48,lVar3 + (long)local_48);
  p_Var1 = &(this->
            super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
            )._M_t._M_impl.super__Rb_tree_header;
  (this->
  super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->
  super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->
  super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->
  super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->
  super_multiset<cmTargetDepend,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  )._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (local_48 != (uint *)&local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT44(uStack_54,local_58) + 1);
  }
  std::
  _Rb_tree<cmTargetDepend,cmTargetDepend,std::_Identity<cmTargetDepend>,cmGlobalGhsMultiGenerator::TargetCompare,std::allocator<cmTargetDepend>>
  ::_M_insert_range_equal<std::_Rb_tree_const_iterator<cmTargetDepend>>
            ((_Rb_tree<cmTargetDepend,cmTargetDepend,std::_Identity<cmTargetDepend>,cmGlobalGhsMultiGenerator::TargetCompare,std::allocator<cmTargetDepend>>
              *)this,(targets->
                     super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                     )._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<cmTargetDepend>)
             &(targets->
              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)
              ._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

cmGlobalGhsMultiGenerator::OrderedTargetDependSet::OrderedTargetDependSet(
  TargetDependSet const& targets, std::string const& first)
  : derived(TargetCompare(first))
{
  this->insert(targets.begin(), targets.end());
}